

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::AddNodePrefixesChecked
               (aiNode *node,char *prefix,uint len,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  char *__s;
  uint uVar1;
  pointer pSVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Logger *this;
  _Rb_tree_color _Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  _Base_ptr p_Var11;
  char *pcVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  bool bVar15;
  
  __s = (node->mName).data;
  uVar1 = (node->mName).length;
  uVar4 = uVar1;
  if (uVar1 == 0) {
    sVar5 = strlen(__s);
    uVar4 = (uint)sVar5;
  }
  uVar10 = 0;
  pcVar12 = __s;
  if (3 < uVar4) {
    uVar3 = uVar4 >> 2;
    uVar10 = 0;
    do {
      uVar10 = (*(ushort *)pcVar12 + uVar10) * 0x10000 ^
               (uint)*(ushort *)(pcVar12 + 2) << 0xb ^ *(ushort *)pcVar12 + uVar10;
      pcVar12 = pcVar12 + 4;
      uVar10 = (uVar10 >> 0xb) + uVar10;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  switch(uVar4 & 3) {
  case 0:
    goto switchD_006168c1_caseD_0;
  case 1:
    uVar4 = (uVar10 + (int)*pcVar12) * 0x400 ^ uVar10 + (int)*pcVar12;
    uVar10 = uVar4 >> 1;
    break;
  case 2:
    uVar4 = (uVar10 + *(ushort *)pcVar12) * 0x800 ^ uVar10 + *(ushort *)pcVar12;
    uVar10 = uVar4 >> 0x11;
    break;
  case 3:
    uVar10 = (uVar10 + *(ushort *)pcVar12) * 0x10000 ^
             (int)pcVar12[2] << 0x12 ^ uVar10 + *(ushort *)pcVar12;
    uVar4 = uVar10 >> 0xb;
  }
  uVar10 = uVar10 + uVar4;
switchD_006168c1_caseD_0:
  pSVar2 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(input->
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
  if (lVar8 != 0) {
    uVar10 = uVar10 * 8 ^ uVar10;
    uVar10 = (uVar10 >> 5) + uVar10;
    uVar10 = uVar10 * 0x10 ^ uVar10;
    uVar10 = (uVar10 >> 0x11) + uVar10;
    uVar10 = uVar10 * 0x2000000 ^ uVar10;
    _Var6 = (uVar10 >> 6) + uVar10;
    uVar7 = (lVar8 >> 5) * -0x5555555555555555;
    uVar9 = 0;
    do {
      if ((uint)uVar9 != cur) {
        p_Var11 = *(_Base_ptr *)((long)&pSVar2[uVar9].hashes._M_t._M_impl + 0x10);
        if (p_Var11 != (_Base_ptr)0x0) {
          p_Var14 = (_Base_ptr)((long)&pSVar2[uVar9].hashes._M_t._M_impl + 8);
          p_Var13 = p_Var14;
          do {
            bVar15 = p_Var11[1]._M_color < _Var6;
            if (!bVar15) {
              p_Var13 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[bVar15];
          } while (p_Var11 != (_Base_ptr)0x0);
          if ((p_Var13 != p_Var14) && (p_Var13[1]._M_color <= _Var6)) {
            if ((uVar1 == 0) || (*__s != '$')) {
              if (uVar1 + len < 0x3ff) {
                memmove(__s + len,__s,(ulong)(uVar1 + 1));
                memcpy(__s,prefix,(ulong)len);
                (node->mName).length = (node->mName).length + len;
              }
              else {
                this = DefaultLogger::get();
                Logger::debug(this,"Can\'t add an unique prefix because the string is too long");
              }
            }
            break;
          }
        }
      }
      uVar9 = (ulong)((uint)uVar9 + 1);
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  if (node->mNumChildren != 0) {
    uVar7 = 0;
    do {
      AddNodePrefixesChecked(node->mChildren[uVar7],prefix,len,input,cur);
      uVar7 = uVar7 + 1;
    } while (uVar7 < node->mNumChildren);
  }
  return;
}

Assistant:

void SceneCombiner::AddNodePrefixesChecked(aiNode* node, const char* prefix, unsigned int len,
        std::vector<SceneHelper>& input, unsigned int cur) {
    ai_assert(NULL != prefix);
    const unsigned int hash = SuperFastHash(node->mName.data, static_cast<uint32_t>(node->mName.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            PrefixString(node->mName,prefix,len);
            break;
        }
    }

    // Process all children recursively
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        AddNodePrefixesChecked(node->mChildren[i],prefix,len,input,cur);
}